

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O3

int __thiscall TinyProcessLib::Process::open(Process *this,char *__file,int __oflag,...)

{
  int iVar1;
  undefined8 in_RCX;
  int __oflag_00;
  undefined8 local_40;
  undefined8 *local_38;
  undefined8 local_30;
  code *local_28;
  code *local_20;
  
  local_30 = 0;
  local_40 = in_RCX;
  local_38 = (undefined8 *)operator_new(0x18);
  *local_38 = __file;
  local_38[1] = ___oflag;
  local_38[2] = &local_40;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/tiny-process-library/process_unix.cpp:164:15)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/tiny-process-library/process_unix.cpp:164:15)>
             ::_M_manager;
  iVar1 = open(this,(char *)&local_38,__oflag_00);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  return iVar1;
}

Assistant:

Process::id_type Process::open(const std::string &command, const std::string &path, const environment_type *environment) noexcept {
  return open([&command, &path, &environment] {
    if(!path.empty()) {
      if(chdir(path.c_str()) != 0)
        exit(1);
    }

    if(!environment)
      execl("/bin/sh", "/bin/sh", "-c", command.c_str(), nullptr);
    else {
      std::vector<std::string> env_strs;
      std::vector<const char *> env_ptrs;
      env_strs.reserve(environment->size());
      env_ptrs.reserve(environment->size() + 1);
      for(const auto &e : *environment) {
        env_strs.emplace_back(e.first + '=' + e.second);
        env_ptrs.emplace_back(env_strs.back().c_str());
      }
      env_ptrs.emplace_back(nullptr);
      execle("/bin/sh", "/bin/sh", "-c", command.c_str(), nullptr, env_ptrs.data());
    }
  });
}